

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_2_0.cpp
# Opt level: O0

void __thiscall QOpenGLFunctions_2_0::~QOpenGLFunctions_2_0(QOpenGLFunctions_2_0 *this)

{
  undefined8 *in_RDI;
  QAbstractOpenGLFunctions *unaff_retaddr;
  
  *in_RDI = &PTR__QOpenGLFunctions_2_0_00214950;
  if (in_RDI[2] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba21e);
  }
  if (in_RDI[3] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba23c);
  }
  if (in_RDI[4] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba25a);
  }
  if (in_RDI[5] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba278);
  }
  if (in_RDI[6] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba296);
  }
  if (in_RDI[7] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba2b4);
  }
  if (in_RDI[8] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba2d2);
  }
  if (in_RDI[9] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba2f0);
  }
  if (in_RDI[10] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba30e);
  }
  if (in_RDI[0xb] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba32c);
  }
  if (in_RDI[0xc] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba34a);
  }
  if (in_RDI[0xd] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1ba368);
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(unaff_retaddr);
  return;
}

Assistant:

QOpenGLFunctions_2_0::~QOpenGLFunctions_2_0()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_3_Core) {
        d_1_3_Core->refs.deref();
        Q_ASSERT(d_1_3_Core->refs.loadRelaxed());
    }
    if (d_1_4_Core) {
        d_1_4_Core->refs.deref();
        Q_ASSERT(d_1_4_Core->refs.loadRelaxed());
    }
    if (d_1_5_Core) {
        d_1_5_Core->refs.deref();
        Q_ASSERT(d_1_5_Core->refs.loadRelaxed());
    }
    if (d_2_0_Core) {
        d_2_0_Core->refs.deref();
        Q_ASSERT(d_2_0_Core->refs.loadRelaxed());
    }
    if (d_1_0_Deprecated) {
        d_1_0_Deprecated->refs.deref();
        Q_ASSERT(d_1_0_Deprecated->refs.loadRelaxed());
    }
    if (d_1_1_Deprecated) {
        d_1_1_Deprecated->refs.deref();
        Q_ASSERT(d_1_1_Deprecated->refs.loadRelaxed());
    }
    if (d_1_2_Deprecated) {
        d_1_2_Deprecated->refs.deref();
        Q_ASSERT(d_1_2_Deprecated->refs.loadRelaxed());
    }
    if (d_1_3_Deprecated) {
        d_1_3_Deprecated->refs.deref();
        Q_ASSERT(d_1_3_Deprecated->refs.loadRelaxed());
    }
    if (d_1_4_Deprecated) {
        d_1_4_Deprecated->refs.deref();
        Q_ASSERT(d_1_4_Deprecated->refs.loadRelaxed());
    }
}